

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManPrintClasses_old(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pGVar4;
  bool bVar5;
  Gia_Man_t *pTemp;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  if (p->vFlopClasses != (Vec_Int_t *)0x0) {
    pTemp._4_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar5 = false;
      if (pTemp._4_4_ < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        pGVar3 = Gia_ManCi(p,iVar1 + pTemp._4_4_);
        bVar5 = pGVar3 != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      uVar2 = Vec_IntEntry(p->vFlopClasses,pTemp._4_4_);
      Abc_Print(1,"%d",(ulong)uVar2);
      pTemp._4_4_ = pTemp._4_4_ + 1;
    }
    Abc_Print(1,"\n");
    pGVar4 = Gia_ManDupFlopClass(p,1);
    Gia_AigerWrite(pGVar4,"dom1.aig",0,0);
    Gia_ManStop(pGVar4);
    pGVar4 = Gia_ManDupFlopClass(p,2);
    Gia_AigerWrite(pGVar4,"dom2.aig",0,0);
    Gia_ManStop(pGVar4);
  }
  return;
}

Assistant:

void Gia_ManPrintClasses_old( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->vFlopClasses == NULL )
        return;
    Gia_ManForEachRo( p, pObj, i )
        Abc_Print( 1, "%d", Vec_IntEntry(p->vFlopClasses, i) );
    Abc_Print( 1, "\n" );

    {
        Gia_Man_t * pTemp;
        pTemp = Gia_ManDupFlopClass( p, 1 );
        Gia_AigerWrite( pTemp, "dom1.aig", 0, 0 );
        Gia_ManStop( pTemp );
        pTemp = Gia_ManDupFlopClass( p, 2 );
        Gia_AigerWrite( pTemp, "dom2.aig", 0, 0 );
        Gia_ManStop( pTemp );
    }
}